

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O3

void __thiscall
Assimp::ColladaParser::ReadAnimationSampler(ColladaParser *this,AnimationChannel *pChannel)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  char *pcVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_type *psVar5;
  string *psVar6;
  char *__s;
  string local_50;
  undefined4 extraout_var_00;
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar1 != '\0') {
    do {
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar1 == 1) {
        if (iVar2 != 1) {
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),"input");
        if (iVar1 == 0) {
          uVar3 = GetAttribute(this,"semantic");
          iVar1 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
          pcVar4 = (char *)CONCAT44(extraout_var_00,iVar1);
          uVar3 = GetAttribute(this,"source");
          iVar1 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
          if (*(char *)CONCAT44(extraout_var_01,iVar1) != '#') {
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_50,"Unsupported URL format","");
            ThrowException(this,&local_50);
          }
          iVar2 = strcmp(pcVar4,"INPUT");
          psVar5 = &(pChannel->mSourceTimes)._M_string_length;
          psVar6 = &pChannel->mSourceTimes;
          if ((((iVar2 == 0) ||
               (iVar2 = strcmp(pcVar4,"OUTPUT"),
               psVar5 = &(pChannel->mSourceValues)._M_string_length,
               psVar6 = &pChannel->mSourceValues, iVar2 == 0)) ||
              (iVar2 = strcmp(pcVar4,"IN_TANGENT"),
              psVar5 = &(pChannel->mInTanValues)._M_string_length, psVar6 = &pChannel->mInTanValues,
              iVar2 == 0)) ||
             ((iVar2 = strcmp(pcVar4,"OUT_TANGENT"),
              psVar5 = &(pChannel->mOutTanValues)._M_string_length,
              psVar6 = &pChannel->mOutTanValues, iVar2 == 0 ||
              (iVar2 = strcmp(pcVar4,"INTERPOLATION"),
              psVar5 = &(pChannel->mInterpolationValues)._M_string_length,
              psVar6 = &pChannel->mInterpolationValues, iVar2 == 0)))) {
            __s = (char *)CONCAT44(extraout_var_01,iVar1) + 1;
            pcVar4 = (char *)*psVar5;
            strlen(__s);
            std::__cxx11::string::_M_replace((ulong)psVar6,0,pcVar4,(ulong)__s);
          }
          iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
          if ((char)iVar1 != '\0') goto LAB_003f445f;
        }
        SkipElement(this);
      }
      else if (iVar2 == 2) {
        iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar1 = strcmp((char *)CONCAT44(extraout_var_02,iVar1),"sampler");
        if (iVar1 == 0) {
          return;
        }
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,"Expected end of <sampler> element.","");
        ThrowException(this,&local_50);
      }
LAB_003f445f:
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar1 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadAnimationSampler(Collada::AnimationChannel& pChannel)
{
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("input"))
            {
                int indexSemantic = GetAttribute("semantic");
                const char* semantic = mReader->getAttributeValue(indexSemantic);
                int indexSource = GetAttribute("source");
                const char* source = mReader->getAttributeValue(indexSource);
                if (source[0] != '#')
                    ThrowException("Unsupported URL format");
                source++;

                if (strcmp(semantic, "INPUT") == 0)
                    pChannel.mSourceTimes = source;
                else if (strcmp(semantic, "OUTPUT") == 0)
                    pChannel.mSourceValues = source;
                else if (strcmp(semantic, "IN_TANGENT") == 0)
                    pChannel.mInTanValues = source;
                else if (strcmp(semantic, "OUT_TANGENT") == 0)
                    pChannel.mOutTanValues = source;
                else if (strcmp(semantic, "INTERPOLATION") == 0)
                    pChannel.mInterpolationValues = source;

                if (!mReader->isEmptyElement())
                    SkipElement();
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "sampler") != 0)
                ThrowException("Expected end of <sampler> element.");

            break;
        }
    }
}